

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O3

void __thiscall
spdlog::details::t_formatter<spdlog::details::null_scoped_padder>::format
          (t_formatter<spdlog::details::null_scoped_padder> *this,log_msg *msg,tm *param_2,
          memory_buf_t *dest)

{
  long lVar1;
  format_decimal_result<char_*> fVar2;
  char local_30 [21];
  char acStack_1b [3];
  char *local_18;
  
  fVar2 = fmt::v9::detail::format_decimal<char,unsigned_long>(local_30,msg->thread_id,0x15);
  local_18 = fVar2.begin;
  lVar1 = (long)local_30 - (long)local_18;
  if (-0x16 < lVar1) {
    fmt::v9::detail::buffer<char>::append<char>
              (&dest->super_buffer<char>,local_18,local_18 + lVar1 + 0x15);
    return;
  }
  fmt::v9::detail::assert_fail
            ("/workspace/llm4binary/github/license_c_cmakelists/rezalas[P]riftshadow/code/include/spdlog/fmt/bundled/core.h"
             ,0x199,"negative value");
}

Assistant:

void format(const details::log_msg &msg, const std::tm &, memory_buf_t &dest) override {
        const auto field_size = ScopedPadder::count_digits(msg.thread_id);
        ScopedPadder p(field_size, padinfo_, dest);
        fmt_helper::append_int(msg.thread_id, dest);
    }